

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O2

size_t Tools::leaf_index(bitset_t *split)

{
  size_type sVar1;
  size_type sVar2;
  invalid_argument *this;
  size_t sVar3;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> dStack_38;
  
  sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(split);
  if (sVar1 == 1) {
    sVar1 = split->m_num_bits;
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first(split);
    sVar3 = ~sVar2 + sVar1;
  }
  else {
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(split);
    sVar1 = split->m_num_bits;
    if (sVar2 != sVar1 - 1) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Not a leaf");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
              (&dStack_38,split);
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                      (&dStack_38);
    sVar3 = sVar1 + ~sVar2;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              (&dStack_38);
  }
  return sVar3;
}

Assistant:

size_t Tools::leaf_index(const bitset_t split) {
    if (split.count() == 1) {
        return split.size() - split.find_first() - 1;
    }
    else if (split.count() == split.size() - 1) {
        return split.size() - (~split).find_first() - 1;
    }
    else {
        throw std::invalid_argument("Not a leaf");
    }
}